

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

class_book * object_kind_to_book(object_kind *kind)

{
  class_book *pcVar1;
  class_book *pcVar2;
  player_class *ppVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  pcVar1 = (class_book *)&classes;
  ppVar3 = classes;
  do {
    if (ppVar3 == (player_class *)0x0) {
      return (class_book *)0x0;
    }
    uVar4 = (ulong)(ppVar3->magic).num_books;
    bVar6 = 0 < (long)uVar4;
    if (0 < (long)uVar4) {
      pcVar2 = (ppVar3->magic).books;
      uVar5 = 1;
      do {
        if ((kind->tval == pcVar2->tval) && (kind->sval == pcVar2->sval)) goto LAB_001bea5c;
        bVar6 = uVar5 < uVar4;
        pcVar2 = pcVar2 + 1;
        bVar7 = uVar5 != uVar4;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
    ppVar3 = ppVar3->next;
    pcVar2 = pcVar1;
LAB_001bea5c:
    pcVar1 = pcVar2;
    if (bVar6) {
      return pcVar2;
    }
  } while( true );
}

Assistant:

const struct class_book *object_kind_to_book(const struct object_kind *kind)
{
	struct player_class *class = classes;
	while (class) {
		int i;

		for (i = 0; i < class->magic.num_books; i++)
		if ((kind->tval == class->magic.books[i].tval) &&
			(kind->sval == class->magic.books[i].sval)) {
			return &class->magic.books[i];
		}
		class = class->next;
	}

	return NULL;
}